

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindow::contextMenuEvent(QMdiSubWindow *this,QContextMenuEvent *contextMenuEvent)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  long in_FS_OFFSET;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x308));
  if (bVar2) {
    if (*(int *)(lVar1 + 0x2f0) != 1) {
      QMdiSubWindowPrivate::getRegion
                ((QMdiSubWindowPrivate *)&stack0xffffffffffffffd0,(Operation)lVar1);
      cVar3 = QRegion::contains((QPoint *)&stack0xffffffffffffffd0);
      QRegion::~QRegion((QRegion *)&stack0xffffffffffffffd0);
      if (cVar3 == '\0') goto LAB_0041c9e8;
    }
    QMenu::exec(*(QMenu **)(lVar1 + 0x310),(QPoint *)(contextMenuEvent + 0x30),(QAction *)0x0);
  }
  else {
LAB_0041c9e8:
    contextMenuEvent[0xc] = (QContextMenuEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::contextMenuEvent(QContextMenuEvent *contextMenuEvent)
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu) {
        contextMenuEvent->ignore();
        return;
    }

    if (d->hoveredSubControl == QStyle::SC_TitleBarSysMenu
            || d->getRegion(QMdiSubWindowPrivate::Move).contains(contextMenuEvent->pos())) {
        d->systemMenu->exec(contextMenuEvent->globalPos());
    } else {
        contextMenuEvent->ignore();
    }
}